

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_template.h
# Opt level: O0

void helper_atomic_sto_be_mmu_sparc64
               (CPUArchState_conflict17 *env,target_ulong addr,Int128 val,TCGMemOpIdx oi,
               uintptr_t retaddr)

{
  undefined1 a [16];
  undefined1 a_00 [16];
  undefined1 val_00 [16];
  Int128 *ptr;
  Int128 *pIVar1;
  undefined4 in_register_00000014;
  undefined8 extraout_RDX;
  TCGMemOpIdx in_R8D;
  uintptr_t in_R9;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  Int128 *haddr;
  uintptr_t retaddr_local;
  TCGMemOpIdx oi_local;
  Int128 val_local;
  target_ulong addr_local;
  CPUArchState_conflict17 *env_local;
  
  ptr = (Int128 *)atomic_mmu_lookup(env,addr,in_R8D,in_R9);
  a._8_8_ = in_stack_ffffffffffffff60;
  a._0_8_ = in_stack_ffffffffffffff58;
  pIVar1 = bswap128((Int128 *)CONCAT44(in_register_00000014,oi),(Int128)a);
  a_00._8_8_ = in_stack_ffffffffffffff60;
  a_00._0_8_ = in_stack_ffffffffffffff58;
  pIVar1 = bswap128(pIVar1,(Int128)a_00);
  val_00._8_8_ = extraout_RDX;
  val_00._0_8_ = pIVar1;
  atomic16_set(ptr,(Int128)val_00);
  return;
}

Assistant:

void ATOMIC_NAME(st)(CPUArchState *env, target_ulong addr,
                     ABI_TYPE val EXTRA_ARGS)
{
    ATOMIC_MMU_DECLS;
    DATA_TYPE *haddr = ATOMIC_MMU_LOOKUP;

    val = BSWAP(val);
    val = BSWAP(val);
    atomic16_set(haddr, val);
    ATOMIC_MMU_CLEANUP;
}